

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1c_vector_op.cpp
# Opt level: O2

void reverse(vector<int,_std::allocator<int>_> *v)

{
  int iVar1;
  pointer piVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  
  piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar4 = (long)piVar3 - (long)piVar2;
  for (uVar5 = 0; piVar3 = piVar3 + -1, uVar5 < (ulong)(lVar4 >> 2) >> 1; uVar5 = uVar5 + 1) {
    iVar1 = piVar2[uVar5];
    piVar2[uVar5] = *piVar3;
    *piVar3 = iVar1;
  }
  return;
}

Assistant:

void reverse(vector<int> &v) {
    for (int i = 0; i < v.size() / 2; i++) {
        swap(v[i], v[v.size() - 1 - i]);
    }
}